

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMachine.cpp
# Opt level: O0

StackMachineModule<long> *
calc4::GenerateStackMachineModule<long>
          (shared_ptr<const_calc4::Operator> *op,CompilationContext *context,
          StackMachineCodeGenerationOption *option)

{
  string_view message;
  bool bVar1;
  mapped_type *pmVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  pointer ppVar5;
  OperatorDefinition *this;
  shared_ptr<const_calc4::Operator> *psVar6;
  undefined8 uVar7;
  allocator_type *__a;
  reference ppVar8;
  reference this_00;
  CompilationContext *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  StackMachineModule<long> *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *pair;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  Generator generator_1;
  vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_> entryPoint;
  Generator generator;
  OperatorImplement *implement_1;
  const_iterator it_1;
  OperatorImplement *implement;
  const_iterator it;
  int index;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  variableIndices;
  unordered_map<calc4::OperatorDefinition,_int,_std::hash<calc4::OperatorDefinition>,_std::equal_to<calc4::OperatorDefinition>,_std::allocator<std::pair<const_calc4::OperatorDefinition,_int>_>_>
  operatorLabels;
  vector<calc4::StackMachineUserDefinedOperator,_std::allocator<calc4::StackMachineUserDefinedOperator>_>
  userDefinedOperators;
  vector<long,_std::allocator<long>_> constTable;
  key_type *in_stack_fffffffffffffbe8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_01;
  undefined4 in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  optional<calc4::OperatorDefinition> *in_stack_fffffffffffffbf8;
  unordered_map<calc4::OperatorDefinition,_int,_std::hash<calc4::OperatorDefinition>,_std::equal_to<calc4::OperatorDefinition>,_std::allocator<std::pair<const_calc4::OperatorDefinition,_int>_>_>
  *in_stack_fffffffffffffc00;
  OperatorDefinition *in_stack_fffffffffffffc08;
  undefined1 *__n;
  vector<calc4::StackMachineUserDefinedOperator,_std::allocator<calc4::StackMachineUserDefinedOperator>_>
  *in_stack_fffffffffffffc10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables_00;
  CompilationContext *in_stack_fffffffffffffc18;
  CompilationContext *pCVar9;
  Generator *in_stack_fffffffffffffc20;
  Generator *this_02;
  OperatorDefinition *in_stack_fffffffffffffc28;
  StackMachineModule<long> *in_stack_fffffffffffffc30;
  int iVar10;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_358;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_350;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_348;
  undefined1 local_339;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  Generator local_318;
  _Base_ptr local_248;
  undefined1 local_239;
  string local_218 [32];
  undefined1 local_1f8 [16];
  optional<calc4::CharPosition> local_1e0 [8];
  int local_11c;
  OperatorImplement *local_110;
  _Self local_108;
  _Self local_100;
  _Base_ptr local_f8;
  OperatorImplement *local_f0;
  _Self local_e8 [3];
  _Self local_d0;
  int local_c4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_c0 [2];
  CompilationContext *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x1568e7);
  std::
  vector<calc4::StackMachineUserDefinedOperator,_std::allocator<calc4::StackMachineUserDefinedOperator>_>
  ::vector((vector<calc4::StackMachineUserDefinedOperator,_std::allocator<calc4::StackMachineUserDefinedOperator>_>
            *)0x1568f4);
  std::
  unordered_map<calc4::OperatorDefinition,_int,_std::hash<calc4::OperatorDefinition>,_std::equal_to<calc4::OperatorDefinition>,_std::allocator<std::pair<const_calc4::OperatorDefinition,_int>_>_>
  ::unordered_map((unordered_map<calc4::OperatorDefinition,_int,_std::hash<calc4::OperatorDefinition>,_std::equal_to<calc4::OperatorDefinition>,_std::allocator<std::pair<const_calc4::OperatorDefinition,_int>_>_>
                   *)0x156901);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)0x15690e);
  local_c4 = 0;
  local_d0._M_node =
       (_Base_ptr)
       CompilationContext::UserDefinedOperatorBegin_abi_cxx11_
                 ((CompilationContext *)in_stack_fffffffffffffbe8);
  while( true ) {
    local_e8[0]._M_node =
         (_Base_ptr)
         CompilationContext::UserDefinedOperatorEnd_abi_cxx11_
                   ((CompilationContext *)in_stack_fffffffffffffbe8);
    bVar1 = std::operator!=(&local_d0,local_e8);
    if (!bVar1) break;
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
                           *)0x156992);
    iVar10 = local_c4;
    local_f0 = &ppVar5->second;
    local_c4 = local_c4 + 1;
    OperatorImplement::GetDefinition(local_f0);
    pmVar2 = std::
             unordered_map<calc4::OperatorDefinition,_int,_std::hash<calc4::OperatorDefinition>,_std::equal_to<calc4::OperatorDefinition>,_std::allocator<std::pair<const_calc4::OperatorDefinition,_int>_>_>
             ::operator[]((unordered_map<calc4::OperatorDefinition,_int,_std::hash<calc4::OperatorDefinition>,_std::equal_to<calc4::OperatorDefinition>,_std::allocator<std::pair<const_calc4::OperatorDefinition,_int>_>_>
                           *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                          in_stack_fffffffffffffbe8);
    *pmVar2 = iVar10;
    local_f8 = (_Base_ptr)
               std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
               ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
                             *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
  }
  cVar3 = CompilationContext::UserDefinedOperatorBegin_abi_cxx11_
                    ((CompilationContext *)in_stack_fffffffffffffbe8);
  local_100._M_node = cVar3._M_node;
  while( true ) {
    cVar4 = CompilationContext::UserDefinedOperatorEnd_abi_cxx11_
                      ((CompilationContext *)in_stack_fffffffffffffbe8);
    local_108._M_node = cVar4._M_node;
    bVar1 = std::operator!=(&local_100,&local_108);
    if (!bVar1) {
      std::vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>::
      vector((vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_> *)
             0x156d5d);
      this_02 = &local_318;
      std::optional<calc4::OperatorDefinition>::optional();
      this_01 = local_c0;
      GenerateStackMachineModule<long>(std::shared_ptr<calc4::Operator_const>const&,calc4::
      CompilationContext_const&,calc4::StackMachineCodeGenerationOption_const&)::Generator::
      Generator(calc4::CompilationContext_const&,calc4::StackMachineCodeGenerationOption_const&,std
      ::vector<long,std::allocator<long>>&,std::unordered_map<calc4::OperatorDefinition,int,std::
      hash<calc4::OperatorDefinition>,std::equal_to<calc4::OperatorDefinition>,std::allocator<std::
      pair<calc4::OperatorDefinition_const,int>>>&,std::optional<calc4::
      OperatorDefinition>const&,std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::
      string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::
      string_const_int>_>_>__
                (this_02,local_20,(StackMachineCodeGenerationOption *)local_18,
                 (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc08,
                 in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)in_stack_fffffffffffffc30);
      std::optional<calc4::OperatorDefinition>::~optional
                ((optional<calc4::OperatorDefinition> *)0x156dd2);
      GenerateStackMachineModule<long>(std::shared_ptr<calc4::Operator_const>const&,calc4::
      CompilationContext_const&,calc4::StackMachineCodeGenerationOption_const&)::Generator::
      Generate(std::shared_ptr<calc4::Operator_const>_const__
                ((Generator *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (shared_ptr<const_calc4::Operator> *)this_01);
      std::vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>::
      operator=((vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>
                 *)in_stack_fffffffffffffc00,
                (vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>
                 *)in_stack_fffffffffffffbf8);
      GenerateStackMachineModule<long>::Generator::~Generator
                ((Generator *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      __a = (allocator_type *)
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)0x156e18);
      __n = &local_339;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x156e2f);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(local_18,(size_type)__n,__a);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x156e55);
      local_348 = local_c0;
      local_350._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::begin(this_01);
      local_358._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(this_01);
      variables_00 = local_18;
      pCVar9 = local_20;
      while( true ) {
        bVar1 = std::__detail::operator!=(&local_350,&local_358);
        if (!bVar1) break;
        ppVar8 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                 ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                              *)0x156eba);
        this_00 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_338,(long)ppVar8->second);
        std::__cxx11::string::operator=((string *)this_00,(string *)ppVar8);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                      *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      }
      StackMachineModule<long>::StackMachineModule
                (in_stack_fffffffffffffc30,
                 (vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>
                  *)in_stack_fffffffffffffc28,(vector<long,_std::allocator<long>_> *)this_02,
                 (vector<calc4::StackMachineUserDefinedOperator,_std::allocator<calc4::StackMachineUserDefinedOperator>_>
                  *)pCVar9,variables_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__a);
      std::vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>::
      ~vector((vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_> *
              )__a);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)0x156fee);
      std::
      unordered_map<calc4::OperatorDefinition,_int,_std::hash<calc4::OperatorDefinition>,_std::equal_to<calc4::OperatorDefinition>,_std::allocator<std::pair<const_calc4::OperatorDefinition,_int>_>_>
      ::~unordered_map((unordered_map<calc4::OperatorDefinition,_int,_std::hash<calc4::OperatorDefinition>,_std::equal_to<calc4::OperatorDefinition>,_std::allocator<std::pair<const_calc4::OperatorDefinition,_int>_>_>
                        *)0x156ffb);
      std::
      vector<calc4::StackMachineUserDefinedOperator,_std::allocator<calc4::StackMachineUserDefinedOperator>_>
      ::~vector((vector<calc4::StackMachineUserDefinedOperator,_std::allocator<calc4::StackMachineUserDefinedOperator>_>
                 *)__a);
      std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)__a);
      return in_RDI;
    }
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
                           *)0x156a9e);
    local_110 = &ppVar5->second;
    pCVar9 = local_20;
    this = OperatorImplement::GetDefinition(local_110);
    std::optional<calc4::OperatorDefinition>::optional<const_calc4::OperatorDefinition_&,_true>
              ((optional<calc4::OperatorDefinition> *)
               CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               in_stack_fffffffffffffbe8);
    in_stack_fffffffffffffbe8 = (key_type *)local_c0;
    GenerateStackMachineModule<long>(std::shared_ptr<calc4::Operator_const>const&,calc4::
    CompilationContext_const&,calc4::StackMachineCodeGenerationOption_const&)::Generator::
    Generator(calc4::CompilationContext_const&,calc4::StackMachineCodeGenerationOption_const&,std::
    vector<long,std::allocator<long>>&,std::unordered_map<calc4::OperatorDefinition,int,std::
    hash<calc4::OperatorDefinition>,std::equal_to<calc4::OperatorDefinition>,std::allocator<std::
    pair<calc4::OperatorDefinition_const,int>>>&,std::optional<calc4::OperatorDefinition>const&,std
    ::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::
    __cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const_int>_>_>__
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (StackMachineCodeGenerationOption *)in_stack_fffffffffffffc10,
               (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc08,
               in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)in_stack_fffffffffffffc30);
    std::optional<calc4::OperatorDefinition>::~optional
              ((optional<calc4::OperatorDefinition> *)0x156b38);
    psVar6 = OperatorImplement::GetOperator(local_110);
    iVar10 = (int)((ulong)psVar6 >> 0x20);
    GenerateStackMachineModule<long>(std::shared_ptr<calc4::Operator_const>const&,calc4::
    CompilationContext_const&,calc4::StackMachineCodeGenerationOption_const&)::Generator::
    Generate(std::shared_ptr<calc4::Operator_const>_const__
              ((Generator *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (shared_ptr<const_calc4::Operator> *)in_stack_fffffffffffffbe8);
    if (local_11c != 0) break;
    in_stack_fffffffffffffc28 = OperatorImplement::GetDefinition(local_110);
    std::
    vector<calc4::StackMachineUserDefinedOperator,std::allocator<calc4::StackMachineUserDefinedOperator>>
    ::
    emplace_back<calc4::OperatorDefinition_const&,std::vector<calc4::StackMachineOperation,std::allocator<calc4::StackMachineOperation>>,int&>
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
               (vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>
                *)in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8);
    GenerateStackMachineModule<long>::Generator::~Generator
              ((Generator *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    local_248 = (_Base_ptr)
                std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
                ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_calc4::OperatorImplement>_>
                              *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
  }
  local_239 = 1;
  uVar7 = __cxa_allocate_exception(0x40);
  std::optional<calc4::CharPosition>::optional(local_1e0);
  std::__cxx11::to_string(iVar10);
  std::operator+((char *)in_stack_fffffffffffffbf8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  local_1f8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_218);
  message._M_str = (char *)cVar3._M_node;
  message._M_len = (size_t)cVar4._M_node;
  Exceptions::AssertionErrorException::AssertionErrorException
            ((AssertionErrorException *)this,(optional<calc4::CharPosition> *)pCVar9,message);
  local_239 = 0;
  __cxa_throw(uVar7,&Exceptions::AssertionErrorException::typeinfo,
              Exceptions::AssertionErrorException::~AssertionErrorException);
}

Assistant:

StackMachineModule<TNumber> GenerateStackMachineModule(
    const std::shared_ptr<const Operator>& op, const CompilationContext& context,
    const StackMachineCodeGenerationOption& option)
{
    static constexpr int OperatorBeginLabel = 0;

    class Generator : public OperatorVisitor
    {
    public:
        const CompilationContext& context;
        StackMachineCodeGenerationOption option;
        std::vector<TNumber>& constTable;
        std::unordered_map<OperatorDefinition, int>& operatorLabels;
        std::optional<OperatorDefinition> definition;
        std::unordered_map<std::string, int>& variableIndices;

        std::vector<StackMachineOperation> operations;
        int nextLabel = OperatorBeginLabel;
        int stackSize = 0;
        int maxStackSize = 0;

        Generator(const CompilationContext& context, const StackMachineCodeGenerationOption& option,
                  std::vector<TNumber>& constTable,
                  std::unordered_map<OperatorDefinition, int>& operatorLabels,
                  const std::optional<OperatorDefinition>& definition,
                  std::unordered_map<std::string, int>& variableIndices)
            : context(context), option(option), constTable(constTable),
              operatorLabels(operatorLabels), definition(definition),
              variableIndices(variableIndices)
        {
        }

        void Generate(const std::shared_ptr<const Operator>& op)
        {
            assert(nextLabel == OperatorBeginLabel);
            AddOperation(StackMachineOpcode::Lavel, nextLabel++);

            if (definition)
            {
                // Generate user-defined operators' codes
                op->Accept(*this);
                AddOperation(StackMachineOpcode::Return, definition.value().GetNumOperands());
            }
            else
            {
                // Generate Main code
                op->Accept(*this);
                AddOperation(StackMachineOpcode::Halt);
            }

            ResolveLabels();
        }

        void ResolveLabels()
        {
            std::vector<StackMachineOperation> newVector;
            std::unordered_map<int, int> labelMap;

            for (auto& operation : operations)
            {
                switch (operation.opcode)
                {
                case StackMachineOpcode::Lavel:
                {
                    int label = static_cast<int>(newVector.size());
                    labelMap[operation.value] = label;
                    break;
                }
                default:
                    newVector.push_back(operation);
                    break;
                }
            }

            for (size_t i = 0; i < newVector.size(); i++)
            {
                auto& operation = newVector[i];

                switch (operation.opcode)
                {
                case StackMachineOpcode::Goto:
                case StackMachineOpcode::GotoIfTrue:
                case StackMachineOpcode::GotoIfEqual:
                case StackMachineOpcode::GotoIfLessThan:
                case StackMachineOpcode::GotoIfLessThanOrEqual:
                    operation.value = labelMap.at(operation.value);
                    break;
                default:
                    break;
                }
            }

            operations = std::move(newVector);
        }

        virtual void Visit(const std::shared_ptr<const ZeroOperator>& op) override
        {
            AddOperation(StackMachineOpcode::LoadConst, 0);
        }

        virtual void Visit(const std::shared_ptr<const PrecomputedOperator>& op) override
        {
            auto value = op->GetValue<TNumber>();

            StackMachineOperation::ValueType casted;
#ifdef ENABLE_GMP
            if constexpr (std::is_same_v<TNumber, mpz_class>)
            {
                casted = static_cast<StackMachineOperation::ValueType>(value.get_si());
            }
            else
#endif // ENABLE_GMP
            {
                casted = static_cast<StackMachineOperation::ValueType>(value);
            }

            if (casted == value)
            {
                // Value fits StackMachineOperation::ValueType
                AddOperation(StackMachineOpcode::LoadConst, casted);
            }
            else
            {
                // We cannot emit Opcode.LoadConst,
                // because the constant value exceeds limit of 16-bit integer.
                // So we use constTable.
                int no = static_cast<int>(constTable.size());
                constTable.push_back(value);
                AddOperation(StackMachineOpcode::LoadConstTable, no);
            }
        }

        virtual void Visit(const std::shared_ptr<const OperandOperator>& op) override
        {
            assert(definition);
            AddOperation(StackMachineOpcode::LoadArg,
                         GetArgumentAddress(definition.value().GetNumOperands(), op->GetIndex()));
        };

        virtual void Visit(const std::shared_ptr<const DefineOperator>& op) override
        {
            AddOperation(StackMachineOpcode::LoadConst, 0);
        };

        virtual void Visit(const std::shared_ptr<const LoadVariableOperator>& op) override
        {
            AddOperation(StackMachineOpcode::LoadVariable,
                         GetOrCreateVariableIndex(op->GetVariableName()));
        };

        virtual void Visit(const std::shared_ptr<const InputOperator>& op) override
        {
            AddOperation(StackMachineOpcode::Input, 0);
        };

        virtual void Visit(const std::shared_ptr<const LoadArrayOperator>& op) override
        {
            op->GetIndex()->Accept(*this);
            AddOperation(StackMachineOpcode::LoadArrayElement);
        };

        virtual void Visit(const std::shared_ptr<const PrintCharOperator>& op) override
        {
            op->GetCharacter()->Accept(*this);
            AddOperation(StackMachineOpcode::PrintChar);
        };

        virtual void Visit(const std::shared_ptr<const ParenthesisOperator>& op) override
        {
            auto& operators = op->GetOperators();

            for (size_t i = 0; i < operators.size(); i++)
            {
                operators[i]->Accept(*this);
                if (i < operators.size() - 1)
                {
                    AddOperation(StackMachineOpcode::Pop);
                }
            }
        }

        virtual void Visit(const std::shared_ptr<const DecimalOperator>& op) override
        {
            op->GetOperand()->Accept(*this);
            AddOperation(StackMachineOpcode::LoadConst, 10);
            AddOperation(StackMachineOpcode::Mult);
            AddOperation(StackMachineOpcode::LoadConst, op->GetValue());
            AddOperation(StackMachineOpcode::Add);
        }

        virtual void Visit(const std::shared_ptr<const StoreVariableOperator>& op) override
        {
            op->GetOperand()->Accept(*this);
            AddOperation(StackMachineOpcode::StoreVariable,
                         GetOrCreateVariableIndex(op->GetVariableName()));
        }

        virtual void Visit(const std::shared_ptr<const StoreArrayOperator>& op) override
        {
            op->GetValue()->Accept(*this);
            op->GetIndex()->Accept(*this);
            AddOperation(StackMachineOpcode::StoreArrayElement);
        }

        virtual void Visit(const std::shared_ptr<const BinaryOperator>& op) override
        {
            auto EmitComparisonBranch = [this](StackMachineOpcode opcode, bool reverse) {
                int ifFalse = nextLabel++, end = nextLabel++;

                AddOperation(opcode, ifFalse);
                AddOperation(StackMachineOpcode::LoadConst, reverse ? 1 : 0);
                AddOperation(StackMachineOpcode::Goto, end);
                AddOperation(StackMachineOpcode::Lavel, ifFalse);
                AddOperation(StackMachineOpcode::LoadConst, reverse ? 0 : 1);
                AddOperation(StackMachineOpcode::Lavel, end);

                // StackSize increased by two due to two LoadConst operations.
                // However, only one of them will be executed.
                // We modify StackSize here.
                AddStackSize(-1);
            };

            op->GetLeft()->Accept(*this);
            op->GetRight()->Accept(*this);

            switch (op->GetType())
            {
            case BinaryType::Add:
                AddOperation(StackMachineOpcode::Add);
                break;
            case BinaryType::Sub:
                AddOperation(StackMachineOpcode::Sub);
                break;
            case BinaryType::Mult:
                AddOperation(StackMachineOpcode::Mult);
                break;
            case BinaryType::Div:
                AddOperation(option.checkZeroDivision ? StackMachineOpcode::DivChecked
                                                      : StackMachineOpcode::Div);
                break;
            case BinaryType::Mod:
                AddOperation(option.checkZeroDivision ? StackMachineOpcode::ModChecked
                                                      : StackMachineOpcode::Mod);
                break;
            case BinaryType::Equal:
                EmitComparisonBranch(StackMachineOpcode::GotoIfEqual, false);
                break;
            case BinaryType::NotEqual:
                EmitComparisonBranch(StackMachineOpcode::GotoIfEqual, true);
                break;
            case BinaryType::LessThan:
                EmitComparisonBranch(StackMachineOpcode::GotoIfLessThan, false);
                break;
            case BinaryType::LessThanOrEqual:
                EmitComparisonBranch(StackMachineOpcode::GotoIfLessThanOrEqual, false);
                break;
            case BinaryType::GreaterThanOrEqual:
                EmitComparisonBranch(StackMachineOpcode::GotoIfLessThan, true);
                break;
            case BinaryType::GreaterThan:
                EmitComparisonBranch(StackMachineOpcode::GotoIfLessThanOrEqual, true);
                break;
            default:
                UNREACHABLE();
                break;
            }
        }

        virtual void Visit(const std::shared_ptr<const ConditionalOperator>& op) override
        {
            int ifTrueLabel = nextLabel++, endLabel = nextLabel++;

            // Helper function to emit code for branch
            // - Call this after generating evaluation code of condition operator
            auto Emit = [this, ifTrueLabel,
                         endLabel](StackMachineOpcode opcode,
                                   const std::shared_ptr<const Operator>& ifTrue,
                                   const std::shared_ptr<const Operator>& ifFalse) {
                AddOperation(opcode, ifTrueLabel);

                int savedStackSize = stackSize;
                ifFalse->Accept(*this);

                auto lastOperation =
                    std::find_if(operations.rbegin(), operations.rend(),
                                 [](auto op) { return op.opcode != StackMachineOpcode::Lavel; });
                if (lastOperation != operations.rend() &&
                    lastOperation->opcode != StackMachineOpcode::Goto)
                {
                    // "Last opcode is Goto" means elimination of "Call" (tail-call)
                    AddOperation(StackMachineOpcode::Goto, endLabel);
                }

                AddOperation(StackMachineOpcode::Lavel, ifTrueLabel);
                stackSize = savedStackSize;
                ifTrue->Accept(*this);
                AddOperation(StackMachineOpcode::Lavel, endLabel);
            };

            if (auto* binary = dynamic_cast<const BinaryOperator*>(op->GetCondition().get()))
            {
                // Special optimiztion for comparisons
                switch (binary->GetType())
                {
                case BinaryType::Equal:
                    binary->GetLeft()->Accept(*this);
                    binary->GetRight()->Accept(*this);
                    Emit(StackMachineOpcode::GotoIfEqual, op->GetIfTrue(), op->GetIfFalse());
                    return;
                case BinaryType::NotEqual:
                    // "a != b ? c ? d" is equivalent to "a == b ? d ? c"
                    binary->GetLeft()->Accept(*this);
                    binary->GetRight()->Accept(*this);
                    Emit(StackMachineOpcode::GotoIfEqual, op->GetIfFalse(), op->GetIfTrue());
                    return;
                case BinaryType::LessThan:
                    binary->GetLeft()->Accept(*this);
                    binary->GetRight()->Accept(*this);
                    Emit(StackMachineOpcode::GotoIfLessThan, op->GetIfTrue(), op->GetIfFalse());
                    return;
                case BinaryType::LessThanOrEqual:
                    binary->GetLeft()->Accept(*this);
                    binary->GetRight()->Accept(*this);
                    Emit(StackMachineOpcode::GotoIfLessThanOrEqual, op->GetIfTrue(),
                         op->GetIfFalse());
                    return;
                case BinaryType::GreaterThanOrEqual:
                    // "a >= b ? c ? d" is equivalent to "a < b ? d ? c"
                    binary->GetLeft()->Accept(*this);
                    binary->GetRight()->Accept(*this);
                    Emit(StackMachineOpcode::GotoIfLessThan, op->GetIfFalse(), op->GetIfTrue());
                    return;
                case BinaryType::GreaterThan:
                    // "a > b ? c ? d" is equivalent to "a <= b ? d ? c"
                    binary->GetLeft()->Accept(*this);
                    binary->GetRight()->Accept(*this);
                    Emit(StackMachineOpcode::GotoIfLessThanOrEqual, op->GetIfFalse(),
                         op->GetIfTrue());
                    return;
                default:
                    break;
                }
            }

            op->GetCondition()->Accept(*this);
            Emit(StackMachineOpcode::GotoIfTrue, op->GetIfTrue(), op->GetIfFalse());
        };

        virtual void Visit(const std::shared_ptr<const UserDefinedOperator>& op) override
        {
            auto operands = op->GetOperands();
            for (size_t i = 0; i < operands.size(); i++)
            {
                operands[i]->Accept(*this);
            }

            if (IsReplaceableWithJump(op))
            {
                for (int i = static_cast<int>(operands.size()) - 1; i >= 0; i--)
                {
                    AddOperation(StackMachineOpcode::StoreArg,
                                 GetArgumentAddress(definition.value().GetNumOperands(), i));
                }

                AddOperation(StackMachineOpcode::Goto, OperatorBeginLabel);

                // If we eliminate tail-call, there are no values left in the stack.
                // We treat as if there are one returning value in the stack.
                AddStackSize(1);
            }
            else
            {
                AddOperation(StackMachineOpcode::Call, operatorLabels[op->GetDefinition()]);
            }
        }

        void AddStackSize(int value)
        {
            int newStackSize = stackSize + value;
            if (newStackSize < 0)
            {
                throw Exceptions::AssertionErrorException(
                    std::nullopt, "Stack size is negative: " + std::to_string(newStackSize));
            }

            maxStackSize = std::max(stackSize, newStackSize);
            stackSize = newStackSize;
        }

        void AddOperation(StackMachineOpcode opcode, StackMachineOperation::ValueType value = 0)
        {
            operations.emplace_back(opcode, value);

            switch (opcode)
            {
            case StackMachineOpcode::Push:
            case StackMachineOpcode::LoadConst:
            case StackMachineOpcode::LoadConstTable:
            case StackMachineOpcode::LoadArg:
            case StackMachineOpcode::LoadVariable:
            case StackMachineOpcode::Input:
                AddStackSize(1);
                break;
            case StackMachineOpcode::Pop:
            case StackMachineOpcode::StoreArg:
            case StackMachineOpcode::StoreArrayElement:
            case StackMachineOpcode::Add:
            case StackMachineOpcode::Sub:
            case StackMachineOpcode::Mult:
            case StackMachineOpcode::Div:
            case StackMachineOpcode::DivChecked:
            case StackMachineOpcode::Mod:
            case StackMachineOpcode::ModChecked:
            case StackMachineOpcode::GotoIfTrue:
            case StackMachineOpcode::Return:
            case StackMachineOpcode::Halt:
                AddStackSize(-1);
                break;
            case StackMachineOpcode::StoreVariable:
            case StackMachineOpcode::LoadArrayElement:
            case StackMachineOpcode::PrintChar:
            case StackMachineOpcode::Goto:
                // Stacksize will not change
                break;
            case StackMachineOpcode::GotoIfEqual:
            case StackMachineOpcode::GotoIfLessThan:
            case StackMachineOpcode::GotoIfLessThanOrEqual:
                AddStackSize(-2);
                break;
            case StackMachineOpcode::Call:
            {
                // Find the corresponding OperatorDefinition
                auto it = std::find_if(operatorLabels.begin(), operatorLabels.end(),
                                       [value](auto& pair) { return pair.second == value; });
                assert(it != operatorLabels.end());

                int numOperands = it->first.GetNumOperands();
                AddStackSize(-(numOperands - 1));
                break;
            }
            case StackMachineOpcode::Lavel:
                // Do nothing
                break;
            default:
                UNREACHABLE();
                break;
            }
        }

        int GetOrCreateVariableIndex(const std::string& variableName)
        {
            auto it = variableIndices.find(variableName);
            if (it != variableIndices.end())
            {
                return it->second;
            }
            else
            {
                int index = static_cast<int>(variableIndices.size());
                variableIndices[variableName] = index;
                return index;
            }
        }

        bool IsReplaceableWithJump(const std::shared_ptr<const UserDefinedOperator>& op) const
        {
            return definition == op->GetDefinition() && op->IsTailCall().value_or(false);
        }

        static int GetArgumentAddress(int numOperands, int index)
        {
            return numOperands - index;
        }
    };

    std::vector<TNumber> constTable;
    std::vector<StackMachineUserDefinedOperator> userDefinedOperators;
    std::unordered_map<OperatorDefinition, int> operatorLabels;
    std::unordered_map<std::string, int> variableIndices;

    int index = 0;
    for (auto it = context.UserDefinedOperatorBegin(); it != context.UserDefinedOperatorEnd(); it++)
    {
        auto& implement = it->second;
        operatorLabels[implement.GetDefinition()] = index++;
    }

    // Generate user-defined operators' codes
    for (auto it = context.UserDefinedOperatorBegin(); it != context.UserDefinedOperatorEnd(); it++)
    {
        auto& implement = it->second;
        Generator generator(context, option, constTable, operatorLabels, implement.GetDefinition(),
                            variableIndices);
        generator.Generate(implement.GetOperator());

        if (generator.stackSize != 0)
        {
            throw Exceptions::AssertionErrorException(
                std::nullopt, "Stacksize is not zero: " + std::to_string(generator.stackSize));
        }

        userDefinedOperators.emplace_back(implement.GetDefinition(),
                                          std::move(generator.operations), generator.maxStackSize);
    }

    // Generate Main code
    std::vector<StackMachineOperation> entryPoint;
    {
        Generator generator(context, option, constTable, operatorLabels, std::nullopt,
                            variableIndices);
        generator.Generate(op);
        entryPoint = std::move(generator.operations);
    }

    std::vector<std::string> variables(variableIndices.size());
    for (auto& pair : variableIndices)
    {
        variables[pair.second] = pair.first;
    }

    return StackMachineModule<TNumber>(entryPoint, constTable, userDefinedOperators, variables);
}